

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::add_sample
          (TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *this,double t,Wrap *v)

{
  Sample s;
  Sample local_18;
  
  local_18.blocked = false;
  local_18.value = *v;
  local_18.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>>
              *)this,&local_18);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }